

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O2

void VP8IteratorStartI4(VP8EncIterator *it)

{
  uint uVar1;
  uint uVar2;
  VP8Encoder *pVVar3;
  uint8_t *puVar4;
  long lVar5;
  
  pVVar3 = it->enc;
  it->i4 = 0;
  puVar4 = it->i4_boundary;
  it->i4_top = it->i4_boundary + 0x11;
  lVar5 = 0x11;
  while (lVar5 != 0) {
    *puVar4 = it->y_left[lVar5 + -2];
    puVar4 = puVar4 + 1;
    lVar5 = lVar5 + -1;
  }
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    it->i4_boundary[lVar5 + 0x11] = it->y_top[lVar5];
  }
  if (it->x < pVVar3->mb_w + -1) {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      it->i4_boundary[lVar5 + 0x21] = it->y_top[lVar5 + 0x10];
    }
  }
  else {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      it->i4_boundary[lVar5 + 0x21] = it->i4_boundary[0x20];
    }
  }
  uVar1 = it->nz[-1];
  uVar2 = *it->nz;
  it->top_nz[0] = uVar2 >> 0xc & 1;
  it->top_nz[1] = uVar2 >> 0xd & 1;
  it->top_nz[2] = uVar2 >> 0xe & 1;
  it->top_nz[3] = uVar2 >> 0xf & 1;
  it->top_nz[4] = uVar2 >> 0x12 & 1;
  it->top_nz[5] = uVar2 >> 0x13 & 1;
  it->top_nz[6] = uVar2 >> 0x16 & 1;
  it->top_nz[7] = uVar2 >> 0x17 & 1;
  it->top_nz[8] = uVar2 >> 0x18 & 1;
  it->left_nz[0] = uVar1 >> 3 & 1;
  it->left_nz[1] = uVar1 >> 7 & 1;
  it->left_nz[2] = uVar1 >> 0xb & 1;
  it->left_nz[3] = uVar1 >> 0xf & 1;
  it->left_nz[4] = uVar1 >> 0x11 & 1;
  it->left_nz[5] = uVar1 >> 0x13 & 1;
  it->left_nz[6] = uVar1 >> 0x15 & 1;
  it->left_nz[7] = uVar1 >> 0x17 & 1;
  return;
}

Assistant:

void VP8IteratorStartI4(VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc;
  int i;

  it->i4 = 0;    // first 4x4 sub-block
  it->i4_top = it->i4_boundary + VP8TopLeftI4[0];

  // Import the boundary samples
  for (i = 0; i < 17; ++i) {    // left
    it->i4_boundary[i] = it->y_left[15 - i];
  }
  for (i = 0; i < 16; ++i) {    // top
    it->i4_boundary[17 + i] = it->y_top[i];
  }
  // top-right samples have a special case on the far right of the picture
  if (it->x < enc->mb_w - 1) {
    for (i = 16; i < 16 + 4; ++i) {
      it->i4_boundary[17 + i] = it->y_top[i];
    }
  } else {    // else, replicate the last valid pixel four times
    for (i = 16; i < 16 + 4; ++i) {
      it->i4_boundary[17 + i] = it->i4_boundary[17 + 15];
    }
  }
#if WEBP_AARCH64 && BPS == 32 && defined(WEBP_MSAN)
  // Intra4Preds_NEON() reads 3 uninitialized bytes from 'i4_boundary' when top
  // is positioned at offset 29 (VP8TopLeftI4[3]). The values are not used
  // meaningfully, but due to limitations in MemorySanitizer related to
  // modeling of tbl instructions, a warning will be issued. This can be
  // removed if MSan is updated to support the instructions. See
  // https://issues.webmproject.org/372109644.
  memset(it->i4_boundary + sizeof(it->i4_boundary) - 3, 0xaa, 3);
#endif
  VP8IteratorNzToBytes(it);  // import the non-zero context
}